

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSubedge::IfcSubedge(IfcSubedge *this)

{
  *(undefined ***)&this->field_0x58 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x60 = 0;
  *(char **)&this->field_0x68 = "IfcSubedge";
  IfcEdge::IfcEdge(&this->super_IfcEdge,&PTR_construction_vtable_24__008b3fa0);
  *(undefined8 *)&(this->super_IfcEdge).field_0x48 = 0;
  *(undefined8 *)&(this->super_IfcEdge).field_0x50 = 0;
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x8b3ee8;
  *(undefined8 *)&this->field_0x58 = 0x8b3f88;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x8b3f10;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x8b3f38;
  *(undefined8 *)&(this->super_IfcEdge).field_0x40 = 0x8b3f60;
  return;
}

Assistant:

IfcSubedge() : Object("IfcSubedge") {}